

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall Json::StyledWriter::writeCommentBeforeValue(StyledWriter *this,Value *root)

{
  bool bVar1;
  char cVar2;
  _Alloc_hider _Var3;
  String local_40;
  
  bVar1 = Value::hasComment(root,commentBefore);
  if (bVar1) {
    cVar2 = (char)this + ' ';
    std::__cxx11::string::push_back(cVar2);
    writeIndent(this);
    Value::getComment_abi_cxx11_(&local_40,root,commentBefore);
    for (_Var3._M_p = local_40._M_dataplus._M_p;
        _Var3._M_p != local_40._M_dataplus._M_p + local_40._M_string_length;
        _Var3._M_p = _Var3._M_p + 1) {
      std::__cxx11::string::push_back(cVar2);
      if (((*_Var3._M_p == '\n') &&
          (_Var3._M_p + 1 != local_40._M_dataplus._M_p + local_40._M_string_length)) &&
         (_Var3._M_p[1] == '/')) {
        writeIndent(this);
      }
    }
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void StyledWriter::writeCommentBeforeValue(const Value& root) {
  if (!root.hasComment(commentBefore))
    return;

  document_ += '\n';
  writeIndent();
  const String& comment = root.getComment(commentBefore);
  String::const_iterator iter = comment.begin();
  while (iter != comment.end()) {
    document_ += *iter;
    if (*iter == '\n' && ((iter + 1) != comment.end() && *(iter + 1) == '/'))
      writeIndent();
    ++iter;
  }

  // Comments are stripped of trailing newlines, so add one here
  document_ += '\n';
}